

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  ZSTD_dStage ZVar1;
  char *pcVar2;
  size_t err_code;
  size_t sVar3;
  ZSTD_dStreamStage ZVar4;
  
  ZVar1 = zds->stage;
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar3 = 0;
    }
    else {
      sVar3 = zds->outBuffSize - zds->outStart;
    }
    sVar3 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar3,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    if ((ZVar1 == ZSTDds_skipFrame) || (ZVar4 = zdss_read, sVar3 != 0)) {
      zds->outEnd = zds->outStart + sVar3;
      ZVar4 = zdss_flush;
    }
    zds->streamStage = ZVar4;
  }
  else {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar3 = 0;
    }
    else {
      sVar3 = (long)oend - (long)*op;
    }
    sVar3 = ZSTD_decompressContinue(zds,*op,sVar3,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    pcVar2 = *op;
    *op = pcVar2 + sVar3;
    zds->streamStage = zdss_read;
    if (oend < pcVar2 + sVar3) {
      __assert_fail("*op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa338,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
    if (zds->outBufferMode != ZSTD_bm_stable) {
      __assert_fail("zds->outBufferMode == ZSTD_bm_stable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa339,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
  }
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}